

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

Error asmjit::v1_14::Formatter::formatTypeId(String *sb,TypeId typeId)

{
  Error EVar1;
  byte bVar2;
  char *str;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,typeId) == 0) {
    str = "void";
  }
  else if ((byte)(typeId - _kBaseStart) < 0x45) {
    bVar2 = TypeUtils::_typeData[typeId] - 0x20;
    if (bVar2 < 0x13) {
      str = &DAT_0014d108 + *(int *)(&DAT_0014d108 + (ulong)bVar2 * 4);
    }
    else {
      str = "unknown";
    }
    if ((byte)TypeUtils::_typeData[(ulong)(byte)TypeUtils::_typeData[typeId] + 0x100] <
        (byte)TypeUtils::_typeData[(ulong)typeId + 0x100]) {
      EVar1 = String::_opFormat(sb,kAppend,"%sx%u",str,
                                (ulong)((byte)TypeUtils::_typeData[(ulong)typeId + 0x100] /
                                       (byte)TypeUtils::_typeData
                                             [(ulong)(byte)TypeUtils::_typeData[typeId] + 0x100]));
      return EVar1;
    }
  }
  else {
    str = "unknown";
  }
  EVar1 = String::_opString(sb,kAppend,str,0xffffffffffffffff);
  return EVar1;
}

Assistant:

Error formatTypeId(String& sb, TypeId typeId) noexcept {
  if (typeId == TypeId::kVoid)
    return sb.append("void");

  if (!TypeUtils::isValid(typeId))
    return sb.append("unknown");

  const char* typeName = nullptr;
  uint32_t typeSize = TypeUtils::sizeOf(typeId);
  TypeId scalarType = TypeUtils::scalarOf(typeId);

  switch (scalarType) {
    case TypeId::kIntPtr : typeName = "intptr" ; break;
    case TypeId::kUIntPtr: typeName = "uintptr"; break;
    case TypeId::kInt8   : typeName = "int8"   ; break;
    case TypeId::kUInt8  : typeName = "uint8"  ; break;
    case TypeId::kInt16  : typeName = "int16"  ; break;
    case TypeId::kUInt16 : typeName = "uint16" ; break;
    case TypeId::kInt32  : typeName = "int32"  ; break;
    case TypeId::kUInt32 : typeName = "uint32" ; break;
    case TypeId::kInt64  : typeName = "int64"  ; break;
    case TypeId::kUInt64 : typeName = "uint64" ; break;
    case TypeId::kFloat32: typeName = "float32"; break;
    case TypeId::kFloat64: typeName = "float64"; break;
    case TypeId::kFloat80: typeName = "float80"; break;
    case TypeId::kMask8  : typeName = "mask8"  ; break;
    case TypeId::kMask16 : typeName = "mask16" ; break;
    case TypeId::kMask32 : typeName = "mask32" ; break;
    case TypeId::kMask64 : typeName = "mask64" ; break;
    case TypeId::kMmx32  : typeName = "mmx32"  ; break;
    case TypeId::kMmx64  : typeName = "mmx64"  ; break;

    default:
      typeName = "unknown";
      break;
  }

  uint32_t baseSize = TypeUtils::sizeOf(scalarType);
  if (typeSize > baseSize) {
    uint32_t count = typeSize / baseSize;
    return sb.appendFormat("%sx%u", typeName, unsigned(count));
  }
  else {
    return sb.append(typeName);
  }
}